

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O3

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
__thiscall
duckdb::InstallFromHttpUrl
          (duckdb *this,DatabaseInstance *db,string *url,string *extension_name,string *temp_path,
          string *param_5,ExtensionInstallOptions *options,
          optional_ptr<duckdb::HTTPLogger,_true> http_logger)

{
  DBConfig *this_00;
  HTTPUtil *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  double dVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  pointer pFVar14;
  type pFVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  pointer pEVar17;
  Response *pRVar18;
  ulong uVar19;
  int *piVar20;
  const_iterator cVar21;
  ExtensionInstallInfo *this_02;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  extraout_RAX;
  unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
  uVar22;
  HTTPException *this_03;
  IOException *this_04;
  Error error;
  char *pcVar23;
  string *psVar24;
  string *params_1;
  size_type *this_05;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar25;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar26;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  undefined8 in_stack_fffffffffffffbb8;
  _Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false> __ptr;
  _Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false> _Var27;
  _Alloc_hider in_stack_fffffffffffffbc8;
  _Alloc_hider _Var28;
  undefined1 local_428 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  string documentation_link;
  ExtensionInstallInfo info;
  string decompressed_body;
  undefined1 local_320 [16];
  undefined1 local_310 [40];
  _Alloc_hider local_2e8;
  optional_ptr<duckdb::HTTPLogger,_true> http_logger_local;
  ulong local_2c8;
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url_base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url_local_part;
  undefined1 local_210 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  code *local_1e0;
  undefined8 uStack_1d8;
  string local_1d0;
  string no_http;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> hostname_without_http;
  string local_50;
  
  http_logger_local = http_logger;
  pcVar5 = (url->_M_dataplus)._M_p;
  params_1 = temp_path;
  local_418._8_8_ = db;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar5,pcVar5 + url->_M_string_length);
  info._0_8_ = &info.full_path._M_string_length;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&info,"http://","");
  local_320._0_8_ = local_310;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_320,anon_var_dwarf_6372561 + 9);
  StringUtil::Replace(&no_http,&local_110,(string *)&info,(string *)local_320);
  if ((undefined1 *)local_320._0_8_ != local_310) {
    operator_delete((void *)local_320._0_8_);
  }
  if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
    operator_delete((void *)info._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  lVar13 = ::std::__cxx11::string::find((char)&no_http,0x2f);
  if (lVar13 == -1) {
    this_04 = (IOException *)__cxa_allocate_exception(0x10);
    info._0_8_ = &info.full_path._M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&info,"No slash in URL template","")
    ;
    IOException::IOException(this_04,(string *)&info);
    __cxa_throw(this_04,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::substr((ulong)&hostname_without_http,(ulong)&no_http);
  ::std::__cxx11::string::substr((ulong)&url_local_part,(ulong)&no_http);
  __ptr._M_head_impl = (ExtensionInstallInfo *)0x0;
  FileSystem::CreateLocal();
  pFVar14 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
            operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                        *)local_320);
  info._0_8_ = &info.full_path._M_string_length;
  pcVar5 = (param_5->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&info,pcVar5,pcVar5 + param_5->_M_string_length);
  ::std::__cxx11::string::append((char *)&info);
  iVar10 = (*pFVar14->_vptr_FileSystem[0x12])(pFVar14,&info,0);
  if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
    operator_delete((void *)info._0_8_);
  }
  if ((char)iVar10 != '\0') {
    pFVar15 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
              operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)local_320);
    info._0_8_ = &info.full_path._M_string_length;
    pcVar5 = (param_5->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&info,pcVar5,pcVar5 + param_5->_M_string_length);
    ::std::__cxx11::string::append((char *)&info);
    ExtensionInstallInfo::TryReadInfoFile
              ((ExtensionInstallInfo *)&decompressed_body,pFVar15,(string *)&info,extension_name);
    _Var27._M_head_impl = (ExtensionInstallInfo *)decompressed_body._M_dataplus;
    decompressed_body._M_dataplus._M_p = (pointer)0x0;
    if (((_Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          )__ptr._M_head_impl != (ExtensionInstallInfo *)0x0) &&
       (::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                  ((default_delete<duckdb::ExtensionInstallInfo> *)&stack0xfffffffffffffbc0,
                   __ptr._M_head_impl), decompressed_body._M_dataplus._M_p != (pointer)0x0)) {
      ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                ((default_delete<duckdb::ExtensionInstallInfo> *)&decompressed_body,
                 (ExtensionInstallInfo *)decompressed_body._M_dataplus._M_p);
    }
    __ptr._M_head_impl = _Var27._M_head_impl;
    decompressed_body._M_dataplus._M_p = (pointer)0x0;
    if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
      operator_delete((void *)info._0_8_);
    }
  }
  if ((long *)local_320._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_320._0_8_ + 8))();
  }
  ::std::operator+(&url_base,"http://",&hostname_without_http);
  local_310._24_8_ = local_310 + 8;
  local_320._0_8_ = (Response *)0x0;
  local_320._8_4_ = 1;
  local_310._8_4_ = 0;
  local_310._16_8_ = (_Base_ptr)0x0;
  local_2e8._M_p = (pointer)0x0;
  paVar1 = &documentation_link.field_2;
  this_00 = (DBConfig *)(local_418._8_8_ + 0x10);
  this_01 = (HTTPUtil *)(local_418._8_8_ + 0x1b0);
  local_2c8 = 0;
  local_310._32_8_ = local_310._24_8_;
  do {
    ::std::__cxx11::string::string
              ((string *)&documentation_link,url_base._M_dataplus._M_p,
               (allocator *)&stack0xfffffffffffffbc8);
    info._0_8_ = &info.full_path._M_string_length;
    info.full_path._M_dataplus._M_p = (pointer)0x0;
    info.full_path._M_string_length = info.full_path._M_string_length & 0xffffffffffffff00;
    decompressed_body._M_string_length = 0;
    decompressed_body.field_2._M_local_buf[0] = '\0';
    decompressed_body._M_dataplus._M_p = (pointer)&decompressed_body.field_2;
    duckdb_httplib::Client::Client
              ((Client *)(local_428 + 0x10),&documentation_link,(string *)&info,&decompressed_body);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decompressed_body._M_dataplus._M_p != &decompressed_body.field_2) {
      operator_delete(decompressed_body._M_dataplus._M_p);
    }
    if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
      operator_delete((void *)info._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)documentation_link._M_dataplus._M_p != paVar1) {
      operator_delete(documentation_link._M_dataplus._M_p);
    }
    if (*(size_type *)(local_418._8_8_ + 0x1b8) != 0) {
      info._0_8_ = &info.full_path._M_string_length;
      info.full_path._M_dataplus._M_p = (pointer)0x0;
      info.full_path._M_string_length = info.full_path._M_string_length & 0xffffffffffffff00;
      HTTPUtil::ParseHTTPProxyHost
                (this_01,(string *)&info,&decompressed_body,(idx_t *)0x50,(idx_t)params_1);
      iVar10 = NumericCastImpl<int,_unsigned_long,_false>::Convert
                         ((unsigned_long)decompressed_body._M_dataplus._M_p);
      uVar7 = local_418._M_allocated_capacity;
      ::std::__cxx11::string::_M_assign((string *)(local_418._M_allocated_capacity + 0x268));
      *(int *)(uVar7 + 0x288) = iVar10;
      if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
        operator_delete((void *)info._0_8_);
      }
    }
    uVar7 = local_418._M_allocated_capacity;
    this_05 = &info.full_path._M_string_length;
    if (*(size_type *)(local_418._8_8_ + 0x1f8) != 0 || *(size_type *)(local_418._8_8_ + 0x1d8) != 0
       ) {
      ::std::__cxx11::string::_M_assign((string *)(local_418._M_allocated_capacity + 0x290));
      ::std::__cxx11::string::_M_assign((string *)(uVar7 + 0x2b0));
    }
    if (http_logger_local.ptr != (HTTPLogger *)0x0) {
      optional_ptr<duckdb::HTTPLogger,_true>::CheckValid(&http_logger_local);
      local_1f0._8_8_ = 0;
      local_1f0._M_allocated_capacity = (size_type)http_logger_local.ptr;
      info.full_path.field_2._M_allocated_capacity =
           (size_type)
           ::std::
           _Function_handler<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/logging/http_logger.hpp:35:10)>
           ::_M_invoke;
      info._0_8_ = http_logger_local.ptr;
      info.full_path._M_dataplus._M_p = (pointer)0x0;
      info.full_path._M_string_length =
           (size_type)
           ::std::
           _Function_handler<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/logging/http_logger.hpp:35:10)>
           ::_M_manager;
      local_1e0 = (code *)0x0;
      uStack_1d8 = 0;
      ::std::function<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&)>::
      operator=((function<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&)>
                 *)(local_418._M_allocated_capacity + 0x2f0),
                (function<void_(const_duckdb_httplib::Request_&,_const_duckdb_httplib::Response_&)>
                 *)&info);
      if (info.full_path._M_string_length != 0) {
        (*(code *)info.full_path._M_string_length)(&info,&info,3);
      }
      if (local_1e0 != (code *)0x0) {
        (*local_1e0)(&local_1f0,&local_1f0,3);
      }
    }
    local_270[0] = local_260;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"%s %s","");
    DBConfig::UserAgent_abi_cxx11_(&local_1d0,this_00);
    pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              DuckDB::SourceID();
    StringUtil::Format<std::__cxx11::string,char_const*>
              (&documentation_link,(StringUtil *)local_270,&local_1d0,pbVar16,(char *)params_1);
    ::std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&info,(char (*) [11])"User-Agent",&documentation_link);
    __l._M_len = 1;
    __l._M_array = (iterator)&info;
    ::std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&decompressed_body,__l,(ci *)&stack0xfffffffffffffbc8,
               (allocator_type *)&stack0xfffffffffffffbbf);
    if ((size_type *)info.full_path.field_2._8_8_ != &info.repository_url._M_string_length) {
      operator_delete((void *)info.full_path.field_2._8_8_);
    }
    if ((size_type *)info._0_8_ != this_05) {
      operator_delete((void *)info._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)documentation_link._M_dataplus._M_p != paVar1) {
      operator_delete(documentation_link._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    if (((options->use_etags == true) && (__ptr._M_head_impl != (ExtensionInstallInfo *)0x0)) &&
       (pEVar17 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                  ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                                *)&stack0xfffffffffffffbc0), (pEVar17->etag)._M_string_length != 0))
    {
      local_290[0] = local_280;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"%s","");
      pEVar17 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                              *)&stack0xfffffffffffffbc0);
      pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_210 + 0x10);
      pcVar5 = (pEVar17->etag)._M_dataplus._M_p;
      local_210._0_8_ = pbVar16;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_210,pcVar5,pcVar5 + (pEVar17->etag)._M_string_length);
      StringUtil::Format<std::__cxx11::string>
                (&documentation_link,(StringUtil *)local_290,(string *)local_210,pbVar16);
      ::std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&info,(char (*) [14])"If-None-Match",&documentation_link);
      in_stack_fffffffffffffbc8._M_p = (pointer)&decompressed_body;
      pVar25 = ::std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::_M_get_insert_equal_pos
                         ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffbc8._M_p,(key_type *)&info);
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,duckdb_httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::
      _M_insert_<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,duckdb_httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,duckdb_httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)in_stack_fffffffffffffbc8._M_p,pVar25.first,pVar25.second,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&info,(_Alloc_node *)&stack0xfffffffffffffbc8);
      if ((size_type *)info.full_path.field_2._8_8_ != &info.repository_url._M_string_length) {
        operator_delete((void *)info.full_path.field_2._8_8_);
      }
      if ((size_type *)info._0_8_ != &info.full_path._M_string_length) {
        operator_delete((void *)info._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)documentation_link._M_dataplus._M_p != paVar1) {
        operator_delete(documentation_link._M_dataplus._M_p);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_210 + 0x10)) {
        operator_delete((void *)local_210._0_8_);
      }
      if (local_290[0] != local_280) {
        operator_delete(local_290[0]);
      }
    }
    ::std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffbc8,url_local_part._M_dataplus._M_p,
               (allocator *)&stack0xfffffffffffffbbf);
    documentation_link.field_2._M_allocated_capacity = 0;
    documentation_link.field_2._8_8_ = 0;
    documentation_link._M_dataplus._M_p = (pointer)0x0;
    documentation_link._M_string_length = 0;
    params_1 = &documentation_link;
    duckdb_httplib::ClientImpl::Get
              ((Result *)&info,(ClientImpl *)local_418._M_allocated_capacity,
               (string *)&stack0xfffffffffffffbc8,(Headers *)&decompressed_body,
               (Progress *)&documentation_link);
    if (documentation_link.field_2._M_allocated_capacity != 0) {
      (*(code *)documentation_link.field_2._M_allocated_capacity)
                (&documentation_link,&documentation_link,3);
    }
    uVar7 = local_320._0_8_;
    local_320._0_8_ = info._0_8_;
    info.mode = UNKNOWN;
    info._1_7_ = 0;
    if ((Response *)uVar7 != (Response *)0x0) {
      duckdb_httplib::Response::~Response((Response *)uVar7);
      operator_delete((void *)uVar7);
    }
    local_320._8_4_ = (uint)info.full_path._M_dataplus._M_p;
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_310);
    if (info.full_path.field_2._8_8_ != 0) {
      local_310._8_4_ = info.full_path.field_2._M_allocated_capacity._0_4_;
      local_310._16_8_ = info.full_path.field_2._8_8_;
      local_310._24_8_ = info.repository_url._M_dataplus._M_p;
      local_310._32_8_ = info.repository_url._M_string_length;
      *(undefined1 **)(info.full_path.field_2._8_8_ + 8) = local_310 + 8;
      local_2e8._M_p = (pointer)info.repository_url.field_2._M_allocated_capacity;
      info.full_path.field_2._8_8_ = 0;
      info.repository_url._M_dataplus._M_p = (pointer)&info.full_path.field_2;
      info.repository_url.field_2._M_allocated_capacity = 0;
      info.repository_url._M_string_length = (size_type)info.repository_url._M_dataplus._M_p;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this_05);
    uVar7 = info._0_8_;
    if (info._0_8_ != 0) {
      duckdb_httplib::Response::~Response((Response *)info._0_8_);
      operator_delete((void *)uVar7);
    }
    info.mode = UNKNOWN;
    info._1_7_ = 0;
    if ((string *)in_stack_fffffffffffffbc8._M_p != (string *)local_428) {
      operator_delete(in_stack_fffffffffffffbc8._M_p);
    }
    if (__ptr._M_head_impl == (ExtensionInstallInfo *)0x0) {
      if ((Response *)local_320._0_8_ == (Response *)0x0) goto LAB_00f634ee;
LAB_00f634da:
      iVar10 = 3;
      pRVar18 = (Response *)local_320._0_8_;
      if (*(int *)(local_320._0_8_ + 0x20) == 200) goto LAB_00f635de;
LAB_00f634f0:
      if (local_320._8_4_ == 0) {
        uVar11 = pRVar18->status - 0x198;
        if (((0x15 < uVar11) || ((0x200401U >> (uVar11 & 0x1f) & 1) == 0)) &&
           ((uVar11 = pRVar18->status - 500, 4 < uVar11 || ((0x19U >> (uVar11 & 0x1f) & 1) == 0))))
        goto LAB_00f63961;
      }
      if (1 < local_2c8) {
LAB_00f63961:
        info.full_path._M_dataplus._M_p = (pointer)0x0;
        info.full_path._M_string_length = info.full_path._M_string_length & 0xffffffffffffff00;
        info._0_8_ = this_05;
        ExtensionHelper::CreateSuggestions(extension_name,(string *)&info);
        ExtensionHelper::ExtensionInstallDocumentationLink(&documentation_link,extension_name);
        if (documentation_link._M_string_length != 0) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffbc8,"\nFor more info, visit ",&documentation_link);
          ::std::__cxx11::string::_M_append((char *)&info,(ulong)in_stack_fffffffffffffbc8._M_p);
          if ((string *)in_stack_fffffffffffffbc8._M_p != (string *)local_428) {
            operator_delete(in_stack_fffffffffffffbc8._M_p);
          }
        }
        uVar9 = local_320._8_4_;
        this_03 = (HTTPException *)__cxa_allocate_exception(0x10);
        uVar7 = local_320._0_8_;
        if (uVar9 != 0) {
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffbc8,
                     "Failed to download extension \"%s\" at URL \"%s%s\"\n%s (ERROR %s)","");
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          pcVar5 = (extension_name->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar5,pcVar5 + extension_name->_M_string_length);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,url_base._M_dataplus._M_p,
                     url_base._M_dataplus._M_p + url_base._M_string_length);
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,url_local_part._M_dataplus._M_p,
                     url_local_part._M_dataplus._M_p + url_local_part._M_string_length);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_190,info._0_8_,info.full_path._M_dataplus._M_p + info._0_8_);
          duckdb_httplib::to_string_abi_cxx11_
                    (&local_50,(duckdb_httplib *)(ulong)(uint)local_320._8_4_,error);
          IOException::
          IOException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    ((IOException *)this_03,(string *)&stack0xfffffffffffffbc8,&local_d0,&local_f0,
                     &local_170,&local_190,&local_50);
          __cxa_throw(this_03,&IOException::typeinfo,::std::runtime_error::~runtime_error);
        }
        _Var28._M_p = local_428;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffbc8,
                   "Failed to download extension \"%s\" at URL \"%s%s\" (HTTP %n)\n%s","");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar5 = (extension_name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar5,pcVar5 + extension_name->_M_string_length);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,url_base._M_dataplus._M_p,
                   url_base._M_dataplus._M_p + url_base._M_string_length);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,url_local_part._M_dataplus._M_p,
                   url_local_part._M_dataplus._M_p + url_local_part._M_string_length);
        local_418._8_8_ = ZEXT48((uint)*(int *)(local_320._0_8_ + 0x20));
        local_150[0] = local_140;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_150,info._0_8_,info.full_path._M_dataplus._M_p + info._0_8_);
        params_4._M_string_length = in_stack_fffffffffffffbb8;
        params_4._M_dataplus._M_p = (pointer)local_150;
        params_4.field_2._M_allocated_capacity = (size_type)__ptr._M_head_impl;
        params_4.field_2._8_8_ = _Var28._M_p;
        HTTPException::
        HTTPException<duckdb_httplib::Response,_0,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  (this_03,(Response *)uVar7,(string *)&stack0xfffffffffffffbc8,&local_90,&local_b0,
                   &local_130,(int)local_418._8_8_,params_4);
        __cxa_throw(this_03,&HTTPException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_2c8 = local_2c8 + 1;
      dVar6 = exp2((double)(long)local_2c8 + -1.0 + (double)(long)local_2c8 + -1.0);
      uVar19 = (ulong)(dVar6 * 100.0);
      uVar19 = (long)(dVar6 * 100.0 - 9.223372036854776e+18) & (long)uVar19 >> 0x3f | uVar19;
      iVar10 = 0;
      if (0 < (long)uVar19) {
        info._0_8_ = uVar19 / 1000;
        info.full_path._M_dataplus._M_p = (pointer)((uVar19 % 1000) * 1000000);
        do {
          iVar12 = nanosleep((timespec *)&info,(timespec *)&info);
          iVar10 = 0;
          if (iVar12 != -1) break;
          piVar20 = __errno_location();
          iVar10 = 0;
        } while (*piVar20 == 4);
      }
    }
    else {
      if ((Response *)local_320._0_8_ == (Response *)0x0) {
LAB_00f634ee:
        pRVar18 = (Response *)0x0;
        goto LAB_00f634f0;
      }
      if (*(int *)(local_320._0_8_ + 0x20) != 0x130) goto LAB_00f634da;
      *(ExtensionInstallInfo **)this = __ptr._M_head_impl;
      __ptr._M_head_impl = (ExtensionInstallInfo *)0x0;
      iVar10 = 1;
    }
LAB_00f635de:
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&decompressed_body);
    if ((ClientImpl *)local_418._M_allocated_capacity != (ClientImpl *)0x0) {
      (**(code **)(*(long *)local_418._M_allocated_capacity + 8))();
    }
    if (iVar10 != 0) {
      if (iVar10 == 3) {
        GZipFileSystem::UncompressGZIPString(&decompressed_body,(string *)(local_320._0_8_ + 0x78));
        paVar2 = &info.repository_url.field_2;
        info._0_8_ = info._0_8_ & 0xffffffffffffff00;
        info.full_path._M_dataplus._M_p = (pointer)&info.full_path.field_2;
        info.full_path._M_string_length = 0;
        info.full_path.field_2._M_allocated_capacity =
             info.full_path.field_2._M_allocated_capacity & 0xffffffffffffff00;
        info.repository_url._M_string_length = 0;
        info.repository_url.field_2._M_allocated_capacity =
             info.repository_url.field_2._M_allocated_capacity & 0xffffffffffffff00;
        paVar3 = &info.version.field_2;
        info.version._M_string_length = 0;
        info.version.field_2._M_local_buf[0] = '\0';
        paVar4 = &info.etag.field_2;
        info.etag._M_string_length = 0;
        info.etag.field_2._M_local_buf[0] = '\0';
        info.repository_url._M_dataplus._M_p = (pointer)paVar2;
        info.version._M_dataplus._M_p = (pointer)paVar3;
        info.etag._M_dataplus._M_p = (pointer)paVar4;
        CheckExtensionMetadataOnInstall
                  ((DatabaseInstance *)local_418._8_8_,decompressed_body._M_dataplus._M_p,
                   decompressed_body._M_string_length,&info,extension_name);
        uVar7 = local_320._0_8_;
        documentation_link._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&documentation_link,"ETag","");
        cVar21 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(uVar7 + 0x48),&documentation_link);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)documentation_link._M_dataplus._M_p != paVar1) {
          operator_delete(documentation_link._M_dataplus._M_p);
        }
        uVar8 = local_320._0_8_;
        if (cVar21._M_node != (_Base_ptr)(uVar7 + 0x50)) {
          _Var28._M_p = local_428;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffbc8,"ETag","");
          pVar26 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)(uVar8 + 0x48),(key_type *)&stack0xfffffffffffffbc8);
          pcVar23 = anon_var_dwarf_6372561 + 9;
          if (pVar26.first._M_node._M_node != pVar26.second._M_node._M_node) {
            pcVar23 = *(char **)(pVar26.first._M_node._M_node + 2);
          }
          ::std::__cxx11::string::string
                    ((string *)&documentation_link,pcVar23,(allocator *)(local_428 + 0x10));
          ::std::__cxx11::string::operator=((string *)&info.etag,(string *)&documentation_link);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)documentation_link._M_dataplus._M_p != paVar1) {
            operator_delete(documentation_link._M_dataplus._M_p);
          }
          if (_Var28._M_p != local_428) {
            operator_delete(_Var28._M_p);
          }
        }
        psVar24 = (string *)&info.full_path;
        if ((options->repository).ptr == (ExtensionRepository *)0x0) {
          info.mode = CUSTOM_PATH;
        }
        else {
          info.mode = REPOSITORY;
          ::std::__cxx11::string::_M_assign(psVar24);
          optional_ptr<duckdb::ExtensionRepository,_true>::CheckValid(&options->repository);
          psVar24 = (string *)&info.repository_url;
        }
        ::std::__cxx11::string::_M_assign(psVar24);
        FileSystem::CreateLocal();
        pFVar15 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
                  operator*((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                             *)&documentation_link);
        WriteExtensionFiles(pFVar15,temp_path,param_5,decompressed_body._M_dataplus._M_p,
                            decompressed_body._M_string_length,&info);
        this_02 = (ExtensionInstallInfo *)operator_new(0x88);
        ExtensionInstallInfo::ExtensionInstallInfo(this_02,&info);
        *(ExtensionInstallInfo **)this = this_02;
        if (documentation_link._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)documentation_link._M_dataplus._M_p + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)info.etag._M_dataplus._M_p != paVar4) {
          operator_delete(info.etag._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)info.version._M_dataplus._M_p != paVar3) {
          operator_delete(info.version._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)info.repository_url._M_dataplus._M_p != paVar2) {
          operator_delete(info.repository_url._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)info.full_path._M_dataplus._M_p != &info.full_path.field_2) {
          operator_delete(info.full_path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decompressed_body._M_dataplus._M_p != &decompressed_body.field_2) {
          operator_delete(decompressed_body._M_dataplus._M_p);
        }
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_duckdb_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_310);
      uVar7 = local_320._0_8_;
      if ((Response *)local_320._0_8_ != (Response *)0x0) {
        duckdb_httplib::Response::~Response((Response *)local_320._0_8_);
        operator_delete((void *)uVar7);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)url_base._M_dataplus._M_p != &url_base.field_2) {
        operator_delete(url_base._M_dataplus._M_p);
      }
      if ((_Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
           )__ptr._M_head_impl != (ExtensionInstallInfo *)0x0) {
        ::std::default_delete<duckdb::ExtensionInstallInfo>::operator()
                  ((default_delete<duckdb::ExtensionInstallInfo> *)&stack0xfffffffffffffbc0,
                   __ptr._M_head_impl);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)url_local_part._M_dataplus._M_p != &url_local_part.field_2) {
        operator_delete(url_local_part._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)hostname_without_http._M_dataplus._M_p != &hostname_without_http.field_2) {
        operator_delete(hostname_without_http._M_dataplus._M_p);
      }
      uVar22._M_t.
      super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
      .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
            )&no_http.field_2;
      if ((__uniq_ptr_data<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true,_true>
           )no_http._M_dataplus._M_p !=
          (__uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
           )uVar22._M_t.
            super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl) {
        operator_delete(no_http._M_dataplus._M_p);
        uVar22._M_t.
        super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
        .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl =
             extraout_RAX._M_t.
             super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
             .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl;
      }
      return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
              )uVar22._M_t.
               super___uniq_ptr_impl<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ExtensionInstallInfo_*,_std::default_delete<duckdb::ExtensionInstallInfo>_>
               .super__Head_base<0UL,_duckdb::ExtensionInstallInfo_*,_false>._M_head_impl;
    }
  } while( true );
}

Assistant:

static unique_ptr<ExtensionInstallInfo> InstallFromHttpUrl(DatabaseInstance &db, const string &url,
                                                           const string &extension_name, const string &temp_path,
                                                           const string &local_extension_path,
                                                           ExtensionInstallOptions &options,
                                                           optional_ptr<HTTPLogger> http_logger) {
	string no_http = StringUtil::Replace(url, "http://", "");

	idx_t next = no_http.find('/', 0);
	if (next == string::npos) {
		throw IOException("No slash in URL template");
	}

	// Push the substring [last, next) on to splits
	auto hostname_without_http = no_http.substr(0, next);
	auto url_local_part = no_http.substr(next);

	unique_ptr<ExtensionInstallInfo> install_info;
	{
		auto fs = FileSystem::CreateLocal();
		if (fs->FileExists(local_extension_path + ".info")) {
			try {
				install_info =
				    ExtensionInstallInfo::TryReadInfoFile(*fs, local_extension_path + ".info", extension_name);
			} catch (...) {
				if (!options.force_install) {
					// We are going to rewrite the file anyhow, so this is fine
					throw;
				}
			}
		}
	}

	auto url_base = "http://" + hostname_without_http;
	// FIXME: the retry logic should be unified with the retry logic in the httpfs client
	static constexpr idx_t MAX_RETRY_COUNT = 3;
	static constexpr uint64_t RETRY_WAIT_MS = 100;
	static constexpr double RETRY_BACKOFF = 4;
	idx_t retry_count = 0;
	duckdb_httplib::Result res;
	while (true) {
		duckdb_httplib::Client cli(url_base.c_str());
		if (!db.config.options.http_proxy.empty()) {
			idx_t port;
			string host;
			HTTPUtil::ParseHTTPProxyHost(db.config.options.http_proxy, host, port);
			cli.set_proxy(host, NumericCast<int>(port));
		}

		if (!db.config.options.http_proxy_username.empty() || !db.config.options.http_proxy_password.empty()) {
			cli.set_proxy_basic_auth(db.config.options.http_proxy_username, db.config.options.http_proxy_password);
		}

		if (http_logger) {
			cli.set_logger(http_logger->GetLogger<duckdb_httplib::Request, duckdb_httplib::Response>());
		}

		duckdb_httplib::Headers headers = {
		    {"User-Agent", StringUtil::Format("%s %s", db.config.UserAgent(), DuckDB::SourceID())}};

		if (options.use_etags && install_info && !install_info->etag.empty()) {
			headers.insert({"If-None-Match", StringUtil::Format("%s", install_info->etag)});
		}

		res = cli.Get(url_local_part.c_str(), headers);
		if (install_info && res && res->status == 304) {
			return install_info;
		}

		if (res && res->status == 200) {
			// success!
			break;
		}
		// failure - check if we should retry
		bool should_retry = false;
		if (res.error() == duckdb_httplib::Error::Success) {
			switch (res->status) {
			case 408: // Request Timeout
			case 418: // Server is pretending to be a teapot
			case 429: // Rate limiter hit
			case 500: // Server has error
			case 503: // Server has error
			case 504: // Server has error
				should_retry = true;
				break;
			default:
				break;
			}
		} else {
			// always retry on duckdb_httplib::Error::Error
			should_retry = true;
		}
		retry_count++;
		if (!should_retry || retry_count >= MAX_RETRY_COUNT) {
			// if we should not retry or exceeded the number of retries - bubble up the error
			string message;
			ExtensionHelper::CreateSuggestions(extension_name, message);

			auto documentation_link = ExtensionHelper::ExtensionInstallDocumentationLink(extension_name);
			if (!documentation_link.empty()) {
				message += "\nFor more info, visit " + documentation_link;
			}
			if (res.error() == duckdb_httplib::Error::Success) {
				throw HTTPException(res.value(), "Failed to download extension \"%s\" at URL \"%s%s\" (HTTP %n)\n%s",
				                    extension_name, url_base, url_local_part, res->status, message);
			} else {
				throw IOException("Failed to download extension \"%s\" at URL \"%s%s\"\n%s (ERROR %s)", extension_name,
				                  url_base, url_local_part, message, to_string(res.error()));
			}
		}
#ifndef DUCKDB_NO_THREADS
		// retry
		// sleep first
		uint64_t sleep_amount = static_cast<uint64_t>(static_cast<double>(RETRY_WAIT_MS) *
		                                              pow(RETRY_BACKOFF, static_cast<double>(retry_count) - 1));
		std::this_thread::sleep_for(std::chrono::milliseconds(sleep_amount));
#endif
	}
	auto decompressed_body = GZipFileSystem::UncompressGZIPString(res->body);

	ExtensionInstallInfo info;
	CheckExtensionMetadataOnInstall(db, (void *)decompressed_body.data(), decompressed_body.size(), info,
	                                extension_name);
	if (res->has_header("ETag")) {
		info.etag = res->get_header_value("ETag");
	}

	if (options.repository) {
		info.mode = ExtensionInstallMode::REPOSITORY;
		info.full_path = url;
		info.repository_url = options.repository->path;
	} else {
		info.mode = ExtensionInstallMode::CUSTOM_PATH;
		info.full_path = url;
	}

	auto fs = FileSystem::CreateLocal();
	WriteExtensionFiles(*fs, temp_path, local_extension_path, (void *)decompressed_body.data(),
	                    decompressed_body.size(), info);

	return make_uniq<ExtensionInstallInfo>(info);
}